

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O1

bool Fossilize::find_extension
               (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *exts,
               char *ext)

{
  pointer pVVar1;
  int iVar2;
  pointer __s2;
  pointer __s2_00;
  long lVar3;
  pointer pVVar4;
  
  __s2 = (exts->super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>).
         _M_impl.super__Vector_impl_data._M_start;
  pVVar1 = (exts->super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar3 = ((long)pVVar1 - (long)__s2 >> 2) * 0xfc0fc0fc0fc0fc1 >> 2;
  __s2_00 = __s2;
  if (0 < lVar3) {
    __s2_00 = __s2 + lVar3 * 4;
    lVar3 = lVar3 + 1;
    do {
      iVar2 = strcmp(ext,__s2->extensionName);
      pVVar4 = __s2;
      if (iVar2 == 0) goto LAB_00105215;
      iVar2 = strcmp(ext,__s2[1].extensionName);
      pVVar4 = __s2 + 1;
      if (iVar2 == 0) goto LAB_00105215;
      iVar2 = strcmp(ext,__s2[2].extensionName);
      pVVar4 = __s2 + 2;
      if (iVar2 == 0) goto LAB_00105215;
      iVar2 = strcmp(ext,__s2[3].extensionName);
      pVVar4 = __s2 + 3;
      if (iVar2 == 0) goto LAB_00105215;
      __s2 = __s2 + 4;
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  lVar3 = ((long)pVVar1 - (long)__s2_00 >> 2) * 0xfc0fc0fc0fc0fc1;
  if (lVar3 != 1) {
    if (lVar3 != 2) {
      pVVar4 = pVVar1;
      if ((lVar3 != 3) || (iVar2 = strcmp(ext,__s2_00->extensionName), pVVar4 = __s2_00, iVar2 == 0)
         ) goto LAB_00105215;
      __s2_00 = __s2_00 + 1;
    }
    iVar2 = strcmp(ext,__s2_00->extensionName);
    pVVar4 = __s2_00;
    if (iVar2 == 0) goto LAB_00105215;
    __s2_00 = __s2_00 + 1;
  }
  iVar2 = strcmp(ext,__s2_00->extensionName);
  pVVar4 = __s2_00;
  if (iVar2 != 0) {
    pVVar4 = pVVar1;
  }
LAB_00105215:
  return pVVar4 != pVVar1;
}

Assistant:

static bool find_extension(const vector<VkExtensionProperties> &exts, const char *ext)
{
	auto itr = find_if(begin(exts), end(exts), [&](const VkExtensionProperties &prop) -> bool {
		return strcmp(ext, prop.extensionName) == 0;
	});
	return itr != end(exts);
}